

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

lys_node * resolve_json_nodeid(char *nodeid,ly_ctx *ctx,lys_node *start)

{
  int iVar1;
  LY_ERR *pLVar2;
  uint8_t *puVar3;
  lys_module *plVar4;
  lys_node *plVar5;
  bool bVar6;
  lys_module *local_b0;
  lys_module *local_98;
  lys_module *prev_mod;
  lys_module *module;
  lys_module *prefix_mod;
  int shorthand;
  int has_predicate;
  int is_relative;
  int mod_name_len;
  int nam_len;
  int r;
  lys_node *start_parent;
  lys_node *sibling;
  char *id;
  char *mod_name;
  char *name;
  char *str;
  char *buf_backup;
  char *module_name;
  lys_node *start_local;
  ly_ctx *ctx_local;
  char *nodeid_local;
  
  module_name = (char *)start;
  start_local = (lys_node *)ctx;
  ctx_local = (ly_ctx *)nodeid;
  buf_backup = ly_buf();
  str = (char *)0x0;
  shorthand = -1;
  prefix_mod._0_4_ = 0;
  if ((ctx_local == (ly_ctx *)0x0) ||
     ((start_local == (lys_node *)0x0 && (module_name == (char *)0x0)))) {
    __assert_fail("nodeid && (ctx || start)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                  ,0x7d4,
                  "const struct lys_node *resolve_json_nodeid(const char *, struct ly_ctx *, const struct lys_node *)"
                 );
  }
  if (start_local == (lys_node *)0x0) {
    start_local = (lys_node *)**(undefined8 **)(module_name + 0x30);
  }
  sibling = (lys_node *)ctx_local;
  mod_name_len = parse_schema_nodeid((char *)ctx_local,&id,&has_predicate,&mod_name,&is_relative,
                                     &shorthand,(int *)((long)&prefix_mod + 4));
  if (mod_name_len < 1) {
    ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
            (ulong)(uint)(int)(char)sibling->padding[(long)-mod_name_len + -0x1c],
            sibling->padding + (long)-mod_name_len + -0x1c);
  }
  else {
    sibling = (lys_node *)(sibling->padding + (long)mod_name_len + -0x1c);
    if (shorthand != 0) {
      if (module_name == (char *)0x0) {
        __assert_fail("start",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                      ,0x7e2,
                      "const struct lys_node *resolve_json_nodeid(const char *, struct ly_ctx *, const struct lys_node *)"
                     );
      }
      _nam_len = (lys_node *)module_name;
      while( true ) {
        bVar6 = false;
        if (_nam_len != (lys_node *)0x0) {
          bVar6 = _nam_len->nodetype == LYS_USES;
        }
        if (!bVar6) break;
        _nam_len = lys_parent(_nam_len);
      }
      prev_mod = *(lys_module **)(module_name + 0x30);
LAB_00118449:
      local_98 = prev_mod;
      do {
        start_parent = (lys_node *)0x0;
        do {
          do {
            start_parent = lys_getnext(start_parent,_nam_len,prev_mod,0xb);
            if (start_parent == (lys_node *)0x0) goto LAB_0011885c;
          } while (((start_parent->name == (char *)0x0) ||
                   (iVar1 = strncmp(mod_name,start_parent->name,(long)is_relative), iVar1 != 0)) ||
                  (start_parent->name[is_relative] != '\0'));
          if (id == (char *)0x0) {
            module = local_98;
          }
          else {
            if (0x3ff < has_predicate) {
              pLVar2 = ly_errno_location();
              *pLVar2 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
                     ,0x81c);
              return (lys_node *)0x0;
            }
            puVar3 = ly_buf_used_location();
            if ((*puVar3 != '\0') && (*buf_backup != '\0')) {
              str = strndup(buf_backup,0x3ff);
            }
            puVar3 = ly_buf_used_location();
            *puVar3 = *puVar3 + '\x01';
            memmove(buf_backup,id,(long)has_predicate);
            buf_backup[has_predicate] = '\0';
            module = ly_ctx_get_module((ly_ctx *)start_local,buf_backup,(char *)0x0);
            if (str != (char *)0x0) {
              strncpy(buf_backup,str,0x3ff);
              free(str);
              str = (char *)0x0;
            }
            puVar3 = ly_buf_used_location();
            *puVar3 = *puVar3 + 0xff;
            if (module == (lys_module *)0x0) {
              name = strndup((char *)ctx_local,
                             (size_t)(id + ((long)has_predicate - (long)ctx_local)));
              ly_vlog(LYE_PATH_INMOD,LY_VLOG_STR,name);
              free(name);
              return (lys_node *)0x0;
            }
          }
          plVar4 = lys_node_module(start_parent);
        } while (module != plVar4);
        if (prefix_mod._4_4_ != 0) {
          mod_name_len = 0;
          if ((start_parent->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
            if (start_parent->nodetype != LYS_LIST) {
              ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                      (ulong)(uint)(int)*(char *)&sibling->name,sibling);
              return (lys_node *)0x0;
            }
            iVar1 = resolve_json_schema_list_predicate
                              ((char *)sibling,(lys_node_list *)start_parent,&mod_name_len);
            if (iVar1 != 0) {
              return (lys_node *)0x0;
            }
          }
          else {
            mod_name_len = parse_schema_json_predicate
                                     ((char *)sibling,(char **)0x0,(int *)0x0,(char **)0x0,
                                      (int *)0x0,(int *)((long)&prefix_mod + 4));
            if (mod_name_len < 1) {
              ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                      (ulong)(uint)(int)(char)sibling->padding[(long)-mod_name_len + -0x1c],
                      sibling->padding + (long)-mod_name_len + -0x1c);
              return (lys_node *)0x0;
            }
          }
          sibling = (lys_node *)(sibling->padding + (long)mod_name_len + -0x1c);
        }
        plVar5 = lys_parent(start_parent);
        if (((plVar5 != (lys_node *)0x0) &&
            (plVar5 = lys_parent(start_parent), plVar5->nodetype == LYS_CHOICE)) &&
           (start_parent->nodetype != LYS_CASE)) {
          prefix_mod._0_4_ = (uint)prefix_mod ^ 0xffffffff;
        }
        if (*(char *)&sibling->name == '\0') {
          if ((uint)prefix_mod != 0) {
            name = strndup((char *)ctx_local,
                           (size_t)(mod_name + ((long)is_relative - (long)ctx_local)));
            ly_vlog(LYE_PATH_INNODE,LY_VLOG_STR,name);
            ly_vlog(LYE_SPEC,LY_VLOG_PREV,(void *)0x0,
                    "Schema shorthand case path must include the virtual case statement.");
            free(name);
            return (lys_node *)0x0;
          }
          return start_parent;
        }
        if ((uint)prefix_mod == 0) {
          if ((start_parent->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) {
            ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                    (ulong)(uint)(int)*(char *)&sibling->name,sibling);
            return (lys_node *)0x0;
          }
          _nam_len = start_parent;
        }
        if (_nam_len == (lys_node *)0x0) {
          local_b0 = prev_mod;
        }
        else {
          local_b0 = _nam_len->child->module;
        }
        local_98 = local_b0;
LAB_0011885c:
        if (start_parent == (lys_node *)0x0) {
          name = strndup((char *)ctx_local,
                         (size_t)(mod_name + ((long)is_relative - (long)ctx_local)));
          ly_vlog(LYE_PATH_INNODE,LY_VLOG_STR,name);
          free(name);
          return (lys_node *)0x0;
        }
        mod_name_len = parse_schema_nodeid((char *)sibling,&id,&has_predicate,&mod_name,&is_relative
                                           ,&shorthand,(int *)((long)&prefix_mod + 4));
        if (mod_name_len < 1) {
          ly_vlog(LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,
                  (ulong)(uint)(int)(char)sibling->padding[(long)-mod_name_len + -0x1c],
                  sibling->padding + (long)-mod_name_len + -0x1c);
          return (lys_node *)0x0;
        }
        sibling = (lys_node *)(sibling->padding + (long)mod_name_len + -0x1c);
      } while( true );
    }
    if (id == (char *)0x0) {
      name = strndup((char *)ctx_local,(size_t)(mod_name + ((long)is_relative - (long)ctx_local)));
      ly_vlog(LYE_PATH_MISSMOD,LY_VLOG_STR,ctx_local);
      free(name);
    }
    else if (has_predicate < 0x400) {
      puVar3 = ly_buf_used_location();
      if ((*puVar3 != '\0') && (*buf_backup != '\0')) {
        str = strndup(buf_backup,0x3ff);
      }
      puVar3 = ly_buf_used_location();
      *puVar3 = *puVar3 + '\x01';
      memmove(buf_backup,id,(long)has_predicate);
      buf_backup[has_predicate] = '\0';
      prev_mod = ly_ctx_get_module((ly_ctx *)start_local,buf_backup,(char *)0x0);
      if (str != (char *)0x0) {
        strcpy(buf_backup,str);
        free(str);
        str = (char *)0x0;
      }
      puVar3 = ly_buf_used_location();
      *puVar3 = *puVar3 + 0xff;
      if (prev_mod != (lys_module *)0x0) {
        _nam_len = (lys_node *)0x0;
        id = (char *)0x0;
        has_predicate = 0;
        goto LAB_00118449;
      }
      name = strndup((char *)ctx_local,(size_t)(id + ((long)has_predicate - (long)ctx_local)));
      ly_vlog(LYE_PATH_INMOD,LY_VLOG_STR,name);
      free(name);
    }
    else {
      pLVar2 = ly_errno_location();
      *pLVar2 = LY_EINT;
      ly_log(LY_LLERR,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/resolve.c"
             ,0x7ef);
    }
  }
  return (lys_node *)0x0;
}

Assistant:

const struct lys_node *
resolve_json_nodeid(const char *nodeid, struct ly_ctx *ctx, const struct lys_node *start)
{
    char *module_name = ly_buf(), *buf_backup = NULL, *str;
    const char *name, *mod_name, *id;
    const struct lys_node *sibling, *start_parent;
    int r, nam_len, mod_name_len, is_relative = -1, has_predicate, shorthand = 0;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *prefix_mod, *module, *prev_mod;

    assert(nodeid && (ctx || start));
    if (!ctx) {
        ctx = start->module->ctx;
    }

    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    id += r;

    if (is_relative) {
        assert(start);
        start_parent = start;
        while (start_parent && (start_parent->nodetype == LYS_USES)) {
            start_parent = lys_parent(start_parent);
        }
        module = start->module;
    } else {
        if (!mod_name) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(LYE_PATH_MISSMOD, LY_VLOG_STR, nodeid);
            free(str);
            return NULL;
        } else if (mod_name_len > LY_BUF_SIZE - 1) {
            LOGINT;
            return NULL;
        }

        if (ly_buf_used && module_name[0]) {
            buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
        }
        ly_buf_used++;

        memmove(module_name, mod_name, mod_name_len);
        module_name[mod_name_len] = '\0';
        module = ly_ctx_get_module(ctx, module_name, NULL);

        if (buf_backup) {
            /* return previous internal buffer content */
            strcpy(module_name, buf_backup);
            free(buf_backup);
            buf_backup = NULL;
        }
        ly_buf_used--;

        if (!module) {
            str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
            LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        start_parent = NULL;

        /* now it's as if there was no module name */
        mod_name = NULL;
        mod_name_len = 0;
    }

    prev_mod = module;

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, module,
                LYS_GETNEXT_WITHCHOICE | LYS_GETNEXT_WITHCASE | LYS_GETNEXT_WITHINOUT))) {
            /* name match */
            if (sibling->name && !strncmp(name, sibling->name, nam_len) && !sibling->name[nam_len]) {
                /* module check */
                if (mod_name) {
                    if (mod_name_len > LY_BUF_SIZE - 1) {
                        LOGINT;
                        return NULL;
                    }

                    if (ly_buf_used && module_name[0]) {
                        buf_backup = strndup(module_name, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;

                    memmove(module_name, mod_name, mod_name_len);
                    module_name[mod_name_len] = '\0';
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_get_module(ctx, module_name, NULL);

                    if (buf_backup) {
                        /* return previous internal buffer content */
                        strncpy(module_name, buf_backup, LY_BUF_SIZE - 1);
                        free(buf_backup);
                        buf_backup = NULL;
                    }
                    ly_buf_used--;

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lys_node_module(sibling)) {
                    continue;
                }

                /* do we have some predicates on it? */
                if (has_predicate) {
                    r = 0;
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if ((r = parse_schema_json_predicate(id, NULL, NULL, NULL, NULL, &has_predicate)) < 1) {
                            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                            return NULL;
                        }
                    } else if (sibling->nodetype == LYS_LIST) {
                        if (resolve_json_schema_list_predicate(id, (const struct lys_node_list *)sibling, &r)) {
                            return NULL;
                        }
                    } else {
                        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    id += r;
                }

                /* check for shorthand cases - then 'start_parent' does not change */
                if (lys_parent(sibling) && (lys_parent(sibling)->nodetype == LYS_CHOICE) && (sibling->nodetype != LYS_CASE)) {
                    shorthand = ~shorthand;
                }

                /* the result node? */
                if (!id[0]) {
                    if (shorthand) {
                        /* wrong path for shorthand */
                        str = strndup(nodeid, (name + nam_len) - nodeid);
                        LOGVAL(LYE_PATH_INNODE, LY_VLOG_STR, str);
                        LOGVAL(LYE_SPEC, LY_VLOG_PREV, NULL, "Schema shorthand case path must include the virtual case statement.");
                        free(str);
                        return NULL;
                    }
                    return sibling;
                }

                if (!shorthand) {
                    /* move down the tree, if possible */
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                        LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    start_parent = sibling;
                }

                /* update prev mod */
                prev_mod = (start_parent ? start_parent->child->module : module);
                break;
            }
        }

        /* no match */
        if (!sibling) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate)) < 1) {
            LOGVAL(LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return NULL;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT;
    return NULL;
}